

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O3

int Indicator(int xj,uint h,int n,uint *I1_start,uint *I1_end)

{
  int R;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  if (n < 0) {
    iVar6 = 0;
  }
  else {
    uVar3 = 0;
    iVar6 = n;
    do {
      uVar2 = uVar3 + iVar6 >> 1;
      if (I1_start[uVar2] < h) {
        uVar3 = uVar2 + 1;
      }
      else {
        if (I1_start[uVar2] <= h) break;
        iVar6 = uVar2 - 1;
      }
      uVar2 = uVar3;
    } while ((int)uVar3 <= iVar6);
    uVar4 = h - xj;
    uVar3 = 0;
    iVar6 = n;
    do {
      uVar5 = uVar3 + iVar6 >> 1;
      if (I1_end[uVar5] < uVar4) {
        uVar3 = uVar5 + 1;
      }
      else {
        if (I1_end[uVar5] <= uVar4) {
          uVar3 = uVar5 + 1;
          break;
        }
        iVar6 = uVar5 - 1;
      }
    } while ((int)uVar3 <= iVar6);
    iVar6 = 0;
    if (((int)uVar3 <= n) && (iVar6 = 0, uVar3 < uVar2)) {
      uVar1 = (ulong)uVar3;
      uVar3 = I1_end[uVar1];
      if (h <= I1_end[uVar1]) {
        uVar3 = h;
      }
      uVar5 = I1_start[uVar1];
      if (I1_start[uVar1] <= uVar4) {
        uVar5 = uVar4;
      }
      iVar6 = 1;
      if (uVar3 < uVar5 + 1) {
        do {
          uVar1 = uVar1 + 1;
          if ((uint)uVar1 == uVar2) break;
          uVar3 = I1_end[uVar1];
          if (h <= I1_end[uVar1]) {
            uVar3 = h;
          }
          uVar5 = I1_start[uVar1];
          if (I1_start[uVar1] <= uVar4) {
            uVar5 = uVar4;
          }
        } while (uVar3 < uVar5 + 1);
        return (uint)(uVar1 < uVar2);
      }
    }
  }
  return iVar6;
}

Assistant:

int first_geq(unsigned int* I_start, int m, int h)
{
    int L = 0, R = m;
    int i;
    while(L<=R)
    {
        i = (L+R) / 2;
        if(I_start[i]<h)
            L = i + 1;
        else if(I_start[i]>h)
            R = i - 1;
        else
            return i;
    }
    return L;  
}